

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O2

int cubeb_enumerate_devices
              (cubeb *context,cubeb_device_type devtype,cubeb_device_collection *collection)

{
  undefined4 *puVar1;
  int iVar2;
  uint uVar3;
  _func_int_cubeb_ptr_cubeb_device_type_cubeb_device_collection_ptr *p_Var4;
  cubeb_device_info *pcVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  char local_b8 [136];
  
  if (collection != (cubeb_device_collection *)0x0 &&
      (devtype & (CUBEB_DEVICE_TYPE_OUTPUT|CUBEB_DEVICE_TYPE_INPUT)) != CUBEB_DEVICE_TYPE_UNKNOWN) {
    p_Var4 = context->ops->enumerate_devices;
    if (p_Var4 == (_func_int_cubeb_ptr_cubeb_device_type_cubeb_device_collection_ptr *)0x0) {
      iVar6 = -4;
    }
    else {
      iVar6 = (*p_Var4)(context,devtype,collection);
      if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
        lVar14 = 0x50;
        for (uVar9 = 0; uVar9 < collection->count; uVar9 = uVar9 + 1) {
          pcVar5 = collection->device;
          local_b8[0x70] = '\0';
          local_b8[0x71] = '\0';
          local_b8[0x72] = '\0';
          local_b8[0x73] = '\0';
          local_b8[0x74] = '\0';
          local_b8[0x75] = '\0';
          local_b8[0x76] = '\0';
          local_b8[0x77] = '\0';
          local_b8[0x78] = '\0';
          local_b8[0x79] = '\0';
          local_b8[0x7a] = '\0';
          local_b8[0x7b] = '\0';
          local_b8[0x7c] = '\0';
          local_b8[0x7d] = '\0';
          local_b8[0x7e] = '\0';
          local_b8[0x7f] = '\0';
          local_b8[0x60] = '\0';
          local_b8[0x61] = '\0';
          local_b8[0x62] = '\0';
          local_b8[99] = '\0';
          local_b8[100] = '\0';
          local_b8[0x65] = '\0';
          local_b8[0x66] = '\0';
          local_b8[0x67] = '\0';
          local_b8[0x68] = '\0';
          local_b8[0x69] = '\0';
          local_b8[0x6a] = '\0';
          local_b8[0x6b] = '\0';
          local_b8[0x6c] = '\0';
          local_b8[0x6d] = '\0';
          local_b8[0x6e] = '\0';
          local_b8[0x6f] = '\0';
          local_b8[0x50] = '\0';
          local_b8[0x51] = '\0';
          local_b8[0x52] = '\0';
          local_b8[0x53] = '\0';
          local_b8[0x54] = '\0';
          local_b8[0x55] = '\0';
          local_b8[0x56] = '\0';
          local_b8[0x57] = '\0';
          local_b8[0x58] = '\0';
          local_b8[0x59] = '\0';
          local_b8[0x5a] = '\0';
          local_b8[0x5b] = '\0';
          local_b8[0x5c] = '\0';
          local_b8[0x5d] = '\0';
          local_b8[0x5e] = '\0';
          local_b8[0x5f] = '\0';
          local_b8[0x40] = '\0';
          local_b8[0x41] = '\0';
          local_b8[0x42] = '\0';
          local_b8[0x43] = '\0';
          local_b8[0x44] = '\0';
          local_b8[0x45] = '\0';
          local_b8[0x46] = '\0';
          local_b8[0x47] = '\0';
          local_b8[0x48] = '\0';
          local_b8[0x49] = '\0';
          local_b8[0x4a] = '\0';
          local_b8[0x4b] = '\0';
          local_b8[0x4c] = '\0';
          local_b8[0x4d] = '\0';
          local_b8[0x4e] = '\0';
          local_b8[0x4f] = '\0';
          local_b8[0x30] = '\0';
          local_b8[0x31] = '\0';
          local_b8[0x32] = '\0';
          local_b8[0x33] = '\0';
          local_b8[0x34] = '\0';
          local_b8[0x35] = '\0';
          local_b8[0x36] = '\0';
          local_b8[0x37] = '\0';
          local_b8[0x38] = '\0';
          local_b8[0x39] = '\0';
          local_b8[0x3a] = '\0';
          local_b8[0x3b] = '\0';
          local_b8[0x3c] = '\0';
          local_b8[0x3d] = '\0';
          local_b8[0x3e] = '\0';
          local_b8[0x3f] = '\0';
          local_b8[0x20] = '\0';
          local_b8[0x21] = '\0';
          local_b8[0x22] = '\0';
          local_b8[0x23] = '\0';
          local_b8[0x24] = '\0';
          local_b8[0x25] = '\0';
          local_b8[0x26] = '\0';
          local_b8[0x27] = '\0';
          local_b8[0x28] = '\0';
          local_b8[0x29] = '\0';
          local_b8[0x2a] = '\0';
          local_b8[0x2b] = '\0';
          local_b8[0x2c] = '\0';
          local_b8[0x2d] = '\0';
          local_b8[0x2e] = '\0';
          local_b8[0x2f] = '\0';
          local_b8[0x10] = '\0';
          local_b8[0x11] = '\0';
          local_b8[0x12] = '\0';
          local_b8[0x13] = '\0';
          local_b8[0x14] = '\0';
          local_b8[0x15] = '\0';
          local_b8[0x16] = '\0';
          local_b8[0x17] = '\0';
          local_b8[0x18] = '\0';
          local_b8[0x19] = '\0';
          local_b8[0x1a] = '\0';
          local_b8[0x1b] = '\0';
          local_b8[0x1c] = '\0';
          local_b8[0x1d] = '\0';
          local_b8[0x1e] = '\0';
          local_b8[0x1f] = '\0';
          local_b8[0] = '\0';
          local_b8[1] = '\0';
          local_b8[2] = '\0';
          local_b8[3] = '\0';
          local_b8[4] = '\0';
          local_b8[5] = '\0';
          local_b8[6] = '\0';
          local_b8[7] = '\0';
          local_b8[8] = '\0';
          local_b8[9] = '\0';
          local_b8[10] = '\0';
          local_b8[0xb] = '\0';
          local_b8[0xc] = '\0';
          local_b8[0xd] = '\0';
          local_b8[0xe] = '\0';
          local_b8[0xf] = '\0';
          iVar2 = *(int *)((long)pcVar5 + lVar14 + -0x28);
          uVar7 = (ulong)*(uint *)((long)pcVar5 + lVar14 + -0x24);
          pcVar12 = "unknown?";
          pcVar11 = "unknown?";
          if (iVar2 == 2) {
            pcVar11 = "output";
          }
          if (iVar2 == 1) {
            pcVar11 = "input";
          }
          if (uVar7 < 3) {
            pcVar12 = &DAT_0012158c + *(int *)(&DAT_0012158c + uVar7 * 4);
          }
          iVar2 = *(int *)((long)pcVar5 + lVar14 + -0x18);
          pcVar10 = "S16LE";
          if (iVar2 != 0x10) {
            if (iVar2 == 0x2000) {
              pcVar10 = "F32BE";
            }
            else if (iVar2 == 0x1000) {
              pcVar10 = "F32LE";
            }
            else if (iVar2 == 0x20) {
              pcVar10 = "S16BE";
            }
            else {
              pcVar10 = "unknown?";
            }
          }
          uVar3 = *(uint *)((long)pcVar5 + lVar14 + -0x1c);
          if ((uVar3 & 0x10) != 0) {
            sVar8 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar8," S16LE",7);
          }
          if ((uVar3 & 0x20) != 0) {
            sVar8 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar8," S16BE",7);
          }
          if ((uVar3 >> 0xc & 1) != 0) {
            sVar8 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar8," F32LE",7);
          }
          if ((uVar3 >> 0xd & 1) != 0) {
            sVar8 = strlen(local_b8);
            builtin_strncpy(local_b8 + sVar8," F32BE",7);
          }
          if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
             (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
            pcVar13 = " (PREFERRED)";
            if (*(int *)((long)pcVar5 + lVar14 + -0x20) == 0) {
              pcVar13 = "";
            }
            puVar1 = (undefined4 *)((long)pcVar5 + lVar14 + -0x38);
            (*g_cubeb_log_callback)
                      ("%s:%d: DeviceID: \"%s\"%s\n\tName:\t\"%s\"\n\tGroup:\t\"%s\"\n\tVendor:\t\"%s\"\n\tType:\t%s\n\tState:\t%s\n\tMaximum channels:\t%u\n\tFormat:\t%s (0x%x) (default: %s)\n\tRate:\t[%u, %u] (default: %u)\n\tLatency: lo %u frames, hi %u frames\n"
                       ,"cubeb.c",0x271,*(undefined8 *)((long)pcVar5 + lVar14 + -0x48),pcVar13,
                       *(undefined8 *)((long)pcVar5 + lVar14 + -0x40),*puVar1,puVar1[2],pcVar11,
                       pcVar12,*(undefined4 *)((long)pcVar5 + lVar14 + -0x14),
                       local_b8 + (local_b8[0] != '\0'),uVar3,pcVar10,
                       *(undefined4 *)((long)pcVar5 + lVar14 + -8),
                       *(undefined4 *)((long)pcVar5 + lVar14 + -0xc),
                       *(undefined4 *)((long)pcVar5 + lVar14 + -0x10),
                       *(undefined4 *)((long)pcVar5 + lVar14 + -4),
                       *(undefined4 *)((long)&pcVar5->devid + lVar14));
          }
          lVar14 = lVar14 + 0x58;
        }
      }
    }
    return iVar6;
  }
  return -3;
}

Assistant:

int
cubeb_enumerate_devices(cubeb * context, cubeb_device_type devtype,
                        cubeb_device_collection * collection)
{
  int rv;
  if ((devtype & (CUBEB_DEVICE_TYPE_INPUT | CUBEB_DEVICE_TYPE_OUTPUT)) == 0)
    return CUBEB_ERROR_INVALID_PARAMETER;
  if (collection == NULL)
    return CUBEB_ERROR_INVALID_PARAMETER;
  if (!context->ops->enumerate_devices)
    return CUBEB_ERROR_NOT_SUPPORTED;

  rv = context->ops->enumerate_devices(context, devtype, collection);

  if (g_cubeb_log_callback) {
    for (size_t i = 0; i < collection->count; i++) {
      log_device(&collection->device[i]);
    }
  }

  return rv;
}